

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

int __thiscall
kratos::FunctionCallStmt::clone
          (FunctionCallStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  UserException *this_00;
  allocator<char> local_39;
  string local_38;
  __fn *local_18;
  FunctionCallStmt *this_local;
  
  local_18 = __fn;
  this_local = this;
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Not implemented",&local_39);
  UserException::UserException(this_00,&local_38);
  __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

std::shared_ptr<Stmt> FunctionCallStmt::clone() const { throw UserException("Not implemented"); }